

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.c
# Opt level: O3

void free_descriptor_address_item(wally_descriptor_address_item *item,size_t item_len)

{
  size_t sVar1;
  wally_descriptor_address_item *dest;
  
  if (item == (wally_descriptor_address_item *)0x0) {
    return;
  }
  sVar1 = item_len;
  dest = item;
  if (item_len != 0) {
    do {
      if (dest->address != (char *)0x0) {
        wally_clear(dest->address,dest->address_len);
        wally_free(dest->address);
      }
      wally_clear(dest,0x18);
      sVar1 = sVar1 - 1;
      dest = dest + 1;
    } while (sVar1 != 0);
  }
  wally_clear(item,item_len * 0x18);
  wally_free(item);
  return;
}

Assistant:

static void free_descriptor_address_item(
    struct wally_descriptor_address_item *item, size_t item_len)
{
    size_t index;
    if (item) {
        for (index = 0; index < item_len; ++index) {
            if (item[index].address) {
                wally_clear((void *)item[index].address, item[index].address_len);
                wally_free((void *)item[index].address);
            }
            wally_clear((void *)&item[index], sizeof(item[index]));
        }
        wally_clear((void *)item, item_len * sizeof(struct wally_descriptor_address_item));
        wally_free((void *)item);
    }
}